

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O0

CloudNode * Lpk_CutTruthBdd(Lpk_Man_t *p,Lpk_Cut_t *pCut)

{
  CloudManager *dd_00;
  Hop_Man_t *p_00;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Hop_Obj_t *pObj_00;
  Abc_Obj_t *pAVar4;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 *paVar5;
  int local_50;
  uint local_4c;
  int k;
  int i;
  CloudNode *pTruth;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Hop_Obj_t *pObjHop;
  Hop_Man_t *pManHop;
  CloudManager *dd;
  Lpk_Cut_t *pCut_local;
  Lpk_Man_t *p_local;
  
  dd_00 = p->pDsdMan->dd;
  p_00 = (Hop_Man_t *)p->pNtk->pManFunc;
  _k = (Abc_Obj_t *)0x0;
  for (local_4c = 0; (int)local_4c < (int)(*(uint *)pCut & 0x3f); local_4c = local_4c + 1) {
    pAVar3 = Abc_NtkObj(p->pNtk,pCut->pLeaves[(int)local_4c]);
    pAVar3->field_6 =
         *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)
          (dd_00->vars + (int)(((*(uint *)pCut & 0x3f) - 1) - local_4c));
  }
  local_4c = *(uint *)pCut >> 6 & 0x3f;
  do {
    local_4c = local_4c - 1;
    if ((int)local_4c < 0) {
      return (CloudNode *)_k;
    }
    pAVar3 = Abc_NtkObj(p->pNtk,pCut->pNodes[(int)local_4c]);
    pObj_00 = Hop_Regular((Hop_Obj_t *)(pAVar3->field_5).pData);
    Hop_ObjCleanData_rec(pObj_00);
    for (local_50 = 0; iVar2 = Abc_ObjFaninNum(pAVar3), local_50 < iVar2; local_50 = local_50 + 1) {
      pAVar4 = Abc_ObjFanin(pAVar3,local_50);
      if (((ulong)(pAVar4->field_6).pTemp & 0xffff0000) == 0) {
        __assert_fail("((unsigned)(ABC_PTRUINT_T)pFanin->pCopy) & 0xffff0000",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                      ,0x6d,"CloudNode *Lpk_CutTruthBdd(Lpk_Man_t *, Lpk_Cut_t *)");
      }
      aVar1 = pAVar4->field_6;
      paVar5 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)Hop_ManPi(p_00,local_50);
      *paVar5 = aVar1;
    }
    _k = (Abc_Obj_t *)Lpk_CutTruthBdd_rec(dd_00,p_00,pObj_00,*(uint *)pCut & 0x3f);
    iVar2 = Hop_IsComplement((Hop_Obj_t *)(pAVar3->field_5).pData);
    if (iVar2 != 0) {
      _k = (Abc_Obj_t *)((ulong)_k ^ 1);
    }
    (pAVar3->field_6).pCopy = _k;
  } while( true );
}

Assistant:

CloudNode * Lpk_CutTruthBdd( Lpk_Man_t * p, Lpk_Cut_t * pCut )
{
    CloudManager * dd = p->pDsdMan->dd;
    Hop_Man_t * pManHop = (Hop_Man_t *)p->pNtk->pManFunc;
    Hop_Obj_t * pObjHop;
    Abc_Obj_t * pObj, * pFanin;
    CloudNode * pTruth = NULL; // Suppress "might be used uninitialized"
    int i, k;

//    return NULL;
//    Lpk_NodePrintCut( p, pCut );
    // initialize the leaves
    Lpk_CutForEachLeaf( p->pNtk, pCut, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)dd->vars[pCut->nLeaves-1-i];

    // construct truth table in the topological order
    Lpk_CutForEachNodeReverse( p->pNtk, pCut, pObj, i )
    {
        // get the local AIG
        pObjHop = Hop_Regular((Hop_Obj_t *)pObj->pData);
        // clean the data field of the nodes in the AIG subgraph
        Hop_ObjCleanData_rec( pObjHop );
        // set the initial truth tables at the fanins
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            assert( ((unsigned)(ABC_PTRUINT_T)pFanin->pCopy) & 0xffff0000 );
            Hop_ManPi( pManHop, k )->pData = pFanin->pCopy;
        }
        // compute the truth table of internal nodes
        pTruth = Lpk_CutTruthBdd_rec( dd, pManHop, pObjHop, pCut->nLeaves );
        if ( Hop_IsComplement((Hop_Obj_t *)pObj->pData) )
            pTruth = Cloud_Not(pTruth);
        // set the truth table at the node
        pObj->pCopy = (Abc_Obj_t *)pTruth;
        
    }

//    Cloud_bddPrint( dd, pTruth );
//    printf( "Bdd size = %d. Total nodes = %d.\n", Cloud_DagSize( dd, pTruth ), dd->nNodesCur-dd->nVars-1 );
    return pTruth;
}